

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

CPpmd_See * Ppmd8_MakeEscFreq(CPpmd8 *p,uint numMasked1,UInt32 *escFreq)

{
  byte bVar1;
  CPpmd8_Context *pCVar2;
  ushort uVar3;
  CPpmd_See *pCVar4;
  UInt32 UVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  pCVar2 = p->MinContext;
  bVar1 = pCVar2->NumStats;
  if (bVar1 == 0xff) {
    pCVar4 = &p->DummySee;
    UVar5 = 1;
  }
  else {
    uVar7 = p->NS2Indx[(ulong)bVar1 + 2] - 3;
    uVar8 = (ulong)((ushort)((ushort)bVar1 + ((ushort)bVar1 + (ushort)bVar1 * 4) * 2 + 0xb) <
                   pCVar2->SummFreq);
    uVar6 = (ulong)((uint)bVar1 + (uint)bVar1 < p->Base[pCVar2->Suffix] + numMasked1);
    pCVar4 = p->See[uVar7] + uVar8 + uVar6 * 2 + (ulong)pCVar2->Flags;
    uVar3 = pCVar4->Summ >> (p->See[uVar7][uVar8 + uVar6 * 2 + (ulong)pCVar2->Flags].Shift & 0x1f);
    pCVar4->Summ = pCVar4->Summ - uVar3;
    UVar5 = (uint)uVar3 + (uint)(uVar3 == 0);
  }
  *escFreq = UVar5;
  return pCVar4;
}

Assistant:

CPpmd_See *Ppmd8_MakeEscFreq(CPpmd8 *p, unsigned numMasked1, UInt32 *escFreq)
{
  CPpmd_See *see;
  if (p->MinContext->NumStats != 0xFF)
  {
    see = p->See[(unsigned)p->NS2Indx[(unsigned)p->MinContext->NumStats + 2] - 3] +
        (p->MinContext->SummFreq > 11 * ((unsigned)p->MinContext->NumStats + 1)) +
        2 * (unsigned)(2 * (unsigned)p->MinContext->NumStats <
        ((unsigned)SUFFIX(p->MinContext)->NumStats + numMasked1)) +
        p->MinContext->Flags;
    {
      unsigned r = (see->Summ >> see->Shift);
      see->Summ = (UInt16)(see->Summ - r);
      *escFreq = r + (r == 0);
    }
  }
  else
  {
    see = &p->DummySee;
    *escFreq = 1;
  }
  return see;
}